

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O0

int check_results(void)

{
  byte bVar1;
  bool bVar2;
  __type _Var3;
  istream *piVar4;
  ostream *poVar5;
  ulong local_478;
  size_t line_number;
  string line2;
  string local_450 [8];
  string line1;
  istream local_420 [8];
  ifstream f2;
  istream local_218 [8];
  ifstream f1;
  int local_c;
  
  std::ifstream::ifstream(local_218,"./test_files/known_good_jlog.txt");
  std::ifstream::ifstream(local_420,"./test_files/jlog.txt",8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TESTS FAILED - couldn\'t open test_files/known_good_jlog.txt\n");
    local_c = 1;
  }
  else {
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,"TESTS FAILED - couldn\'t open test_files/jlog.txt\n");
      local_c = 1;
    }
    else {
      std::__cxx11::string::string(local_450);
      std::__cxx11::string::string((string *)&line_number);
      local_478 = 0;
      do {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_450)
        ;
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar2) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    (local_420,(string *)&line_number);
          bVar1 = std::ios::eof();
          if ((bVar1 & 1) == 0) {
            std::operator<<((ostream *)&std::cerr,
                            "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (jlog was longer than known_good)\n"
                           );
            local_c = 1;
          }
          else {
            std::operator<<((ostream *)&std::cout,"TESTS PASSED\n");
            local_c = 0;
          }
          goto LAB_00124c3e;
        }
        local_478 = local_478 + 1;
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           (local_420,(string *)&line_number);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      } while ((bVar2) &&
              (_Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_450,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&line_number), _Var3));
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (line "
                              );
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_478);
      std::operator<<(poVar5,")\n");
      local_c = 1;
LAB_00124c3e:
      std::__cxx11::string::~string((string *)&line_number);
      std::__cxx11::string::~string(local_450);
    }
  }
  std::ifstream::~ifstream(local_420);
  std::ifstream::~ifstream(local_218);
  return local_c;
}

Assistant:

int check_results()
{
    ifstream f1("./test_files/known_good_jlog.txt");
    ifstream f2("./test_files/jlog.txt");

    if (!f1.is_open())
    {
        cerr << "TESTS FAILED - couldn't open test_files/known_good_jlog.txt\n";
        return 1;
    }

    if (!f2.is_open())
    {
        cerr << "TESTS FAILED - couldn't open test_files/jlog.txt\n";
        return 1;
    }

    string line1;
    string line2;

    size_t line_number = 0;

    while (getline(f1, line1))
    {
        line_number++;

        if (getline(f2, line2))
        {
            if (line1 == line2)
            {
                continue;
            }
        }
        cerr << "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (line " << line_number << ")\n";
        return 1;
    }

    (void)getline(f2, line2);

    if (f2.eof())
    {
        cout << "TESTS PASSED\n";
    }
    else
    {
        cerr << "TESTS FAILED - compare test_files/jlog.txt with test_files/known_good_jlog.txt (jlog was longer than known_good)\n";
        return 1;
    }

    return 0;
}